

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O0

void * block_slice(uint16_t units)

{
  int *piVar1;
  long *in_FS_OFFSET;
  void *mem;
  block_s *blk;
  void *pvStack_10;
  uint16_t units_local;
  
  mem = (void *)**(undefined8 **)(*in_FS_OFFSET + -0x2b0);
  if ((block_s *)mem == (block_s *)0x0) {
    mem = block_new();
    **(undefined8 **)(*in_FS_OFFSET + -0x2b0) = mem;
  }
  else if (0x7fe < (uint)((block_s *)mem)->pos + (uint)units) {
    block_free((block_s *)mem);
    mem = block_new();
    **(undefined8 **)(*in_FS_OFFSET + -0x2b0) = mem;
  }
  if (mem == (void *)0x0) {
    piVar1 = __errno_location();
    *piVar1 = 0xc;
    pvStack_10 = (void *)0x0;
  }
  else {
    pvStack_10 = (void *)((long)mem + (ulong)*(ushort *)((long)mem + 10) * 0x10);
    LOCK();
    *(short *)((long)mem + 8) = *(short *)((long)mem + 8) + 1;
    UNLOCK();
    *(uint16_t *)((long)mem + 10) = *(short *)((long)mem + 10) + units;
    if (0x7fd < *(ushort *)((long)mem + 10)) {
      block_free((block_s *)mem);
      **(undefined8 **)(*in_FS_OFFSET + -0x2b0) = 0;
    }
  }
  return pvStack_10;
}

Assistant:

static inline void *block_slice(uint16_t units) {
  block_s *blk = arena_last_used->block;
  if (!blk) {
    /* arena is empty */
    blk = block_new();
    arena_last_used->block = blk;
  } else if (blk->pos + units > FIO_MEMORY_MAX_SLICES_PER_BLOCK) {
    /* not enough memory in the block - rotate */
    block_free(blk);
    blk = block_new();
    arena_last_used->block = blk;
  }
  if (!blk) {
    /* no system memory available? */
    errno = ENOMEM;
    return NULL;
  }
  /* slice block starting at blk->pos and increase reference count */
  const void *mem = (void *)((uintptr_t)blk + ((uintptr_t)blk->pos << 4));
  fio_atomic_add(&blk->ref, 1);
  blk->pos += units;
  if (blk->pos >= FIO_MEMORY_MAX_SLICES_PER_BLOCK) {
    /* ... the block was fully utilized, clear arena */
    block_free(blk);
    arena_last_used->block = NULL;
  }
  return (void *)mem;
}